

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.cpp
# Opt level: O0

int main(void)

{
  ssize_t sVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  code *pcVar3;
  Aio local_20;
  Aio aio;
  float float_value;
  uint16_t value;
  
  signal(2,sig_handler);
  pcVar3 = (code *)0x0;
  mraa::Aio::Aio(&local_20,0);
  __buf = extraout_RDX;
  while (flag != 0) {
    sVar1 = mraa::Aio::read(&local_20,(int)pcVar3,__buf,in_RCX);
    aio.m_aio._4_4_ = mraa::Aio::readFloat(&local_20);
    poVar2 = std::operator<<((ostream *)&std::cout,"ADC A0 read %X - %d");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)sVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)sVar1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"ADC A0 read float - %.5f");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,aio.m_aio._4_4_);
    pcVar3 = std::endl<char,std::char_traits<char>>;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __buf = extraout_RDX_00;
  }
  mraa::Aio::~Aio(&local_20);
  return 0;
}

Assistant:

int
main(void)
{
    uint16_t value;
    float float_value;

    signal(SIGINT, sig_handler);

    //! [Interesting]
    /* initialize AIO */
    mraa::Aio aio(AIO_PORT);

    while (flag) {
        value = aio.read();
        float_value = aio.readFloat();
        std::cout << "ADC A0 read %X - %d" << value << value << std::endl;
        std::cout << "ADC A0 read float - %.5f" << float_value << std::endl;
    }
    //! [Interesting]

    return EXIT_SUCCESS;
}